

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O0

word luckyCanonicizer_final_fast_6Vars1(word InOut,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  uint uVar1;
  word wVar2;
  uint *pCanonPhase_local;
  char *pCanonPerm_local;
  int *pStore_local;
  word InOut_local;
  
  pStore_local = (int *)InOut;
  uVar1 = Kit_TruthSemiCanonicize_Yasha1((word *)&pStore_local,6,pCanonPerm,pStore);
  *pCanonPhase = uVar1;
  pStore_local = (int *)Extra_Truth6MinimumRoundMany1
                                  ((word)pStore_local,pStore,pCanonPerm,pCanonPhase);
  Kit_TruthChangePhase_64bit((word *)&pStore_local,6,5);
  Kit_TruthChangePhase_64bit((word *)&pStore_local,6,4);
  Kit_TruthChangePhase_64bit((word *)&pStore_local,6,3);
  Kit_TruthChangePhase_64bit((word *)&pStore_local,6,2);
  Kit_TruthChangePhase_64bit((word *)&pStore_local,6,1);
  Kit_TruthChangePhase_64bit((word *)&pStore_local,6,0);
  *pCanonPhase = *pCanonPhase ^ 0x3f;
  wVar2 = Extra_Truth6MinimumRoundMany1((word)pStore_local,pStore,pCanonPerm,pCanonPhase);
  return wVar2;
}

Assistant:

word luckyCanonicizer_final_fast_6Vars1(word InOut, int* pStore, char* pCanonPerm, unsigned* pCanonPhase )
{
    (* pCanonPhase) = Kit_TruthSemiCanonicize_Yasha1( &InOut, 6, pCanonPerm, pStore);
    InOut = Extra_Truth6MinimumRoundMany1(InOut, pStore, pCanonPerm, pCanonPhase);
    Kit_TruthChangePhase_64bit( &InOut, 6, 5 );
    Kit_TruthChangePhase_64bit( &InOut, 6, 4 );
    Kit_TruthChangePhase_64bit( &InOut, 6, 3 );
    Kit_TruthChangePhase_64bit( &InOut, 6, 2 );
    Kit_TruthChangePhase_64bit( &InOut, 6, 1 );        
    Kit_TruthChangePhase_64bit( &InOut, 6, 0 );
    (*pCanonPhase) ^= 0x3F;
    return Extra_Truth6MinimumRoundMany1(InOut, pStore, pCanonPerm, pCanonPhase); 
}